

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
write_pointer<unsigned_long>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long value,
          format_specs *specs)

{
  wchar_t *pwVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  unsigned_long uVar4;
  wchar_t *pwVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  pointer_writer<unsigned_long> pw;
  format_specs specs_copy;
  pointer_writer<unsigned_long> local_58;
  format_specs local_48;
  
  uVar4 = value;
  lVar7 = 2;
  do {
    lVar6 = lVar7;
    lVar7 = lVar6 + 1;
    bVar9 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar9);
  local_58.num_digits = (int)lVar6 + -1;
  local_58.value = value;
  if (specs == (format_specs *)0x0) {
    pbVar2 = (this->out_).container;
    sVar3 = pbVar2->size_;
    uVar8 = lVar7 + sVar3;
    if (pbVar2->capacity_ < uVar8) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar8);
    }
    pbVar2->size_ = uVar8;
    pwVar5 = pbVar2->ptr_;
    pwVar1 = pwVar5 + sVar3;
    pwVar1[0] = L'0';
    pwVar1[1] = L'x';
    pwVar5 = pwVar5 + sVar3 + (long)local_58.num_digits + 1;
    do {
      *pwVar5 = (int)"0123456789abcdef"[(uint)local_58.value & 0xf];
      pwVar5 = pwVar5 + -1;
      bVar9 = 0xf < local_58.value;
      local_58.value = local_58.value >> 4;
    } while (bVar9);
  }
  else {
    local_48.width = specs->width;
    local_48.precision = specs->precision;
    local_48.type = specs->type;
    local_48._9_3_ = *(undefined3 *)&specs->field_0x9;
    local_48.fill.data_[0] = (specs->fill).data_[0];
    local_48.fill.data_._4_8_ = *(undefined8 *)((specs->fill).data_ + 1);
    local_48.fill.data_._12_8_ = *(undefined8 *)((specs->fill).data_ + 3);
    local_48._32_8_ = *(undefined8 *)((specs->fill).data_ + 5);
    if ((local_48._8_8_ & 0xf00) == 0) {
      local_48._8_8_ = local_48._8_8_ | 0x200;
    }
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this,&local_48,&local_58);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }